

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O2

void jinit_forward_dct(j_compress_ptr cinfo)

{
  J_DCT_METHOD JVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  jpeg_forward_dct *pjVar4;
  code *pcVar5;
  _func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
  *p_Var6;
  long lVar7;
  bool bVar8;
  
  pjVar4 = (jpeg_forward_dct *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x90);
  cinfo->fdct = pjVar4;
  pjVar4->start_pass = start_pass_fdctmgr;
  JVar1 = cinfo->dct_method;
  if (JVar1 == JDCT_FLOAT) {
    pjVar4->forward_DCT = forward_DCT_float;
    iVar3 = jsimd_can_fdct_float();
    if (iVar3 == 0) {
      pcVar5 = jpeg_fdct_float;
    }
    else {
      pcVar5 = jsimd_fdct_float;
    }
    pjVar4[5].start_pass = pcVar5;
  }
  else {
    if (JVar1 == JDCT_IFAST) {
      pjVar4->forward_DCT = forward_DCT;
      iVar3 = jsimd_can_fdct_ifast();
      if (iVar3 == 0) {
        pcVar5 = jpeg_fdct_ifast;
      }
      else {
        pcVar5 = jsimd_fdct_ifast;
      }
    }
    else {
      if (JVar1 != JDCT_ISLOW) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x30;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
        goto LAB_00107430;
      }
      pjVar4->forward_DCT = forward_DCT;
      iVar3 = jsimd_can_fdct_islow();
      if (iVar3 == 0) {
        pcVar5 = jpeg_fdct_islow;
      }
      else {
        pcVar5 = jsimd_fdct_islow;
      }
    }
    pjVar4[1].start_pass = pcVar5;
  }
LAB_00107430:
  if (cinfo->dct_method < JDCT_FLOAT) {
    iVar3 = jsimd_can_convsamp();
    if (iVar3 == 0) {
      pcVar5 = convsamp;
    }
    else {
      pcVar5 = jsimd_convsamp;
    }
    pjVar4[1].forward_DCT = pcVar5;
    iVar3 = jsimd_can_quantize();
    if (iVar3 == 0) {
      pcVar5 = quantize;
    }
    else {
      pcVar5 = jsimd_quantize;
    }
    pjVar4[2].start_pass = pcVar5;
  }
  else if (cinfo->dct_method == JDCT_FLOAT) {
    iVar3 = jsimd_can_convsamp_float();
    if (iVar3 == 0) {
      pcVar5 = convsamp_float;
    }
    else {
      pcVar5 = jsimd_convsamp_float;
    }
    pjVar4[5].forward_DCT = pcVar5;
    iVar3 = jsimd_can_quantize_float();
    if (iVar3 == 0) {
      pcVar5 = quantize_float;
    }
    else {
      pcVar5 = jsimd_quantize_float;
    }
    pjVar4[6].start_pass = pcVar5;
  }
  else {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x30;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  bVar8 = cinfo->dct_method == JDCT_FLOAT;
  p_Var6 = (_func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
            *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,(ulong)bVar8 * 0x80 + 0x80);
  pjVar4[(ulong)bVar8 * 4 + 4].forward_DCT = p_Var6;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    (&pjVar4[2].forward_DCT)[lVar7] =
         (_func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
          *)0x0;
    (&pjVar4[6].forward_DCT)[lVar7] =
         (_func_void_j_compress_ptr_jpeg_component_info_ptr_JSAMPARRAY_JBLOCKROW_JDIMENSION_JDIMENSION_JDIMENSION
          *)0x0;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_forward_dct(j_compress_ptr cinfo)
{
  my_fdct_ptr fdct;
  int i;

  fdct = (my_fdct_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_fdct_controller));
  cinfo->fdct = (struct jpeg_forward_dct *)fdct;
  fdct->pub.start_pass = start_pass_fdctmgr;

  /* First determine the DCT... */
  switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
  case JDCT_ISLOW:
    fdct->pub.forward_DCT = forward_DCT;
    if (jsimd_can_fdct_islow())
      fdct->dct = jsimd_fdct_islow;
    else
      fdct->dct = jpeg_fdct_islow;
    break;
#endif
#ifdef DCT_IFAST_SUPPORTED
  case JDCT_IFAST:
    fdct->pub.forward_DCT = forward_DCT;
    if (jsimd_can_fdct_ifast())
      fdct->dct = jsimd_fdct_ifast;
    else
      fdct->dct = jpeg_fdct_ifast;
    break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
  case JDCT_FLOAT:
    fdct->pub.forward_DCT = forward_DCT_float;
    if (jsimd_can_fdct_float())
      fdct->float_dct = jsimd_fdct_float;
    else
      fdct->float_dct = jpeg_fdct_float;
    break;
#endif
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
    break;
  }

  /* ...then the supporting stages. */
  switch (cinfo->dct_method) {
#ifdef DCT_ISLOW_SUPPORTED
  case JDCT_ISLOW:
#endif
#ifdef DCT_IFAST_SUPPORTED
  case JDCT_IFAST:
#endif
#if defined(DCT_ISLOW_SUPPORTED) || defined(DCT_IFAST_SUPPORTED)
    if (jsimd_can_convsamp())
      fdct->convsamp = jsimd_convsamp;
    else
      fdct->convsamp = convsamp;
    if (jsimd_can_quantize())
      fdct->quantize = jsimd_quantize;
    else
      fdct->quantize = quantize;
    break;
#endif
#ifdef DCT_FLOAT_SUPPORTED
  case JDCT_FLOAT:
    if (jsimd_can_convsamp_float())
      fdct->float_convsamp = jsimd_convsamp_float;
    else
      fdct->float_convsamp = convsamp_float;
    if (jsimd_can_quantize_float())
      fdct->float_quantize = jsimd_quantize_float;
    else
      fdct->float_quantize = quantize_float;
    break;
#endif
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
    break;
  }

  /* Allocate workspace memory */
#ifdef DCT_FLOAT_SUPPORTED
  if (cinfo->dct_method == JDCT_FLOAT)
    fdct->float_workspace = (FAST_FLOAT *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(FAST_FLOAT) * DCTSIZE2);
  else
#endif
    fdct->workspace = (DCTELEM *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  sizeof(DCTELEM) * DCTSIZE2);

  /* Mark divisor tables unallocated */
  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    fdct->divisors[i] = NULL;
#ifdef DCT_FLOAT_SUPPORTED
    fdct->float_divisors[i] = NULL;
#endif
  }
}